

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_make_path_table_2(archive_write *a,vdd *vdd,int depth,int *dir_number)

{
  path_table *ppVar1;
  int iVar2;
  isoent **ppiVar3;
  isoent *piVar4;
  long lVar5;
  size_t __nmemb;
  
  ppVar1 = vdd->pathtbl + depth;
  __nmemb = (size_t)vdd->pathtbl[depth].cnt;
  if (__nmemb == 0) {
    ppVar1->sorted = (isoent **)0x0;
  }
  else {
    ppiVar3 = (isoent **)malloc(__nmemb * 8);
    if (ppiVar3 == (isoent **)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    ppVar1->sorted = ppiVar3;
    for (piVar4 = ppVar1->first; piVar4 != (isoent *)0x0; piVar4 = piVar4->ptnext) {
      *ppiVar3 = piVar4;
      ppiVar3 = ppiVar3 + 1;
    }
    ppiVar3 = ppVar1->sorted;
    if ((ulong)vdd->vdd_type < 3) {
      qsort(ppiVar3,__nmemb,8,(__compar_fn_t)(&PTR__compare_path_table_002bd110)[vdd->vdd_type]);
    }
    if (0 < ppVar1->cnt) {
      lVar5 = 0;
      do {
        iVar2 = *dir_number;
        *dir_number = iVar2 + 1;
        ppiVar3[lVar5]->dir_number = iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 < ppVar1->cnt);
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
isoent_make_path_table_2(struct archive_write *a, struct vdd *vdd,
    int depth, int *dir_number)
{
	struct isoent *np;
	struct isoent **enttbl;
	struct path_table *pt;
	int i;

	pt = &vdd->pathtbl[depth];
	if (pt->cnt == 0) {
		pt->sorted = NULL;
		return (ARCHIVE_OK);
	}
	enttbl = malloc(pt->cnt * sizeof(struct isoent *));
	if (enttbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	pt->sorted = enttbl;
	for (np = pt->first; np != NULL; np = np->ptnext)
		*enttbl ++ = np;
	enttbl = pt->sorted;

	switch (vdd->vdd_type) {
	case VDD_PRIMARY:
	case VDD_ENHANCED:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table);
#endif
		break;
	case VDD_JOLIET:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table_joliet);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table_joliet);
#endif
		break;
	}
	for (i = 0; i < pt->cnt; i++)
		enttbl[i]->dir_number = (*dir_number)++;

	return (ARCHIVE_OK);
}